

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int inflatePrime(z_streamp strm,int bits,int value)

{
  uint uVar1;
  internal_state *piVar2;
  
  if (strm == (z_streamp)0x0) {
    return -2;
  }
  piVar2 = strm->state;
  if (piVar2 == (internal_state *)0x0) {
    return -2;
  }
  if (bits < 0) {
    *(undefined8 *)(piVar2 + 0x48) = 0;
    *(undefined4 *)(piVar2 + 0x50) = 0;
  }
  else {
    if (0x10 < (uint)bits) {
      return -2;
    }
    uVar1 = *(int *)(piVar2 + 0x50) + bits;
    if (0x20 < uVar1) {
      return -2;
    }
    *(long *)(piVar2 + 0x48) =
         *(long *)(piVar2 + 0x48) +
         (long)(int)((~(uint)(-1L << ((byte)bits & 0x3f)) & value) <<
                    ((byte)*(int *)(piVar2 + 0x50) & 0x1f));
    *(uint *)(piVar2 + 0x50) = uVar1;
  }
  return 0;
}

Assistant:

int ZEXPORT inflatePrime(strm, bits, value)
z_streamp strm;
int bits;
int value;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (bits < 0) {
        state->hold = 0;
        state->bits = 0;
        return Z_OK;
    }
    if (bits > 16 || state->bits + bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += value << state->bits;
    state->bits += bits;
    return Z_OK;
}